

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveTermAppender.h
# Opt level: O2

int32_t __thiscall
aeron::concurrent::logbuffer::ExclusiveTermAppender::appendFragmentedMessage
          (ExclusiveTermAppender *this,int32_t termId,int32_t termOffset,HeaderWriter *header,
          AtomicBuffer *srcBuffer,index_t srcOffset,index_t length,index_t maxPayloadLength,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  length_t termLength;
  bool bVar1;
  byte bVar2;
  int32_t iVar3;
  long v;
  uint uVar4;
  index_t iVar5;
  int iVar6;
  byte v_00;
  int iVar7;
  index_t length_00;
  
  uVar4 = 0;
  if (0 < length % maxPayloadLength) {
    uVar4 = length % maxPayloadLength + 0x3fU & 0xffffffe0;
  }
  termLength = this->m_termBuffer->m_length;
  iVar7 = uVar4 + termOffset + (maxPayloadLength + 0x20) * (length / maxPayloadLength);
  *this->m_tailAddr = CONCAT44(termId,iVar7);
  if ((int)termLength < iVar7) {
    iVar3 = handleEndOfLogCondition(this->m_termBuffer,termId,termOffset,header,termLength);
    return iVar3;
  }
  bVar2 = 0x80;
  iVar5 = length;
  do {
    length_00 = maxPayloadLength;
    if (iVar5 < maxPayloadLength) {
      length_00 = iVar5;
    }
    v_00 = bVar2 | 0x40;
    if (maxPayloadLength < iVar5) {
      v_00 = bVar2;
    }
    uVar4 = length_00 + 0x20;
    HeaderWriter::write(header,(int)this->m_termBuffer,(void *)(ulong)(uint)termOffset,(ulong)uVar4)
    ;
    AtomicBuffer::putBytes
              (this->m_termBuffer,termOffset + 0x20,srcBuffer,(srcOffset + length) - iVar5,length_00
              );
    AtomicBuffer::putUInt8(this->m_termBuffer,termOffset + 5,v_00);
    v = std::function<long_(aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
                  (reservedValueSupplier,this->m_termBuffer,termOffset,uVar4);
    AtomicBuffer::putInt64(this->m_termBuffer,termOffset + 0x18,v);
    AtomicBuffer::putInt32Ordered(this->m_termBuffer,termOffset,uVar4);
    termOffset = (length_00 + 0x3fU & 0xffffffe0) + termOffset;
    bVar2 = 0;
    iVar6 = iVar5 - length_00;
    bVar1 = length_00 <= iVar5;
    iVar5 = iVar6;
  } while (iVar6 != 0 && bVar1);
  return iVar7;
}

Assistant:

std::int32_t appendFragmentedMessage(
        std::int32_t termId,
        std::int32_t termOffset,
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        util::index_t maxPayloadLength,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        const int numMaxPayloads = length / maxPayloadLength;
        const util::index_t remainingPayload = length % maxPayloadLength;
        const util::index_t lastFrameLength = (remainingPayload > 0) ?
            util::BitUtil::align(remainingPayload + DataFrameHeader::LENGTH, FrameDescriptor::FRAME_ALIGNMENT) : 0;
        const util::index_t requiredLength =
            (numMaxPayloads * (maxPayloadLength + DataFrameHeader::LENGTH)) + lastFrameLength;

        const std::int32_t termLength = m_termBuffer.capacity();

        std::int32_t resultingOffset = termOffset + requiredLength;
        putRawTailOrdered(termId, resultingOffset);

        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termId, termOffset, header, termLength);
        }
        else
        {
            std::uint8_t flags = FrameDescriptor::BEGIN_FRAG;
            util::index_t remaining = length;
            std::int32_t offset = static_cast<std::int32_t>(termOffset);

            do
            {
                const util::index_t bytesToWrite = std::min(remaining, maxPayloadLength);
                const util::index_t frameLength = bytesToWrite + DataFrameHeader::LENGTH;
                const util::index_t alignedLength = util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

                header.write(m_termBuffer, offset, frameLength, termId);
                m_termBuffer.putBytes(
                    offset + DataFrameHeader::LENGTH,
                    srcBuffer,
                    srcOffset + (length - remaining),
                    bytesToWrite);

                if (remaining <= maxPayloadLength)
                {
                    flags |= FrameDescriptor::END_FRAG;
                }

                FrameDescriptor::frameFlags(m_termBuffer, offset, flags);

                const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, offset, frameLength);
                m_termBuffer.putInt64(offset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

                FrameDescriptor::frameLengthOrdered(m_termBuffer, offset, frameLength);

                flags = 0;
                offset += alignedLength;
                remaining -= bytesToWrite;
            }
            while (remaining > 0);
        }

        return resultingOffset;
    }